

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O1

ostream * operator<<(ostream *ostream,Order *order)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"ID: ",4);
  *(undefined8 *)(&ostream->field_0x10 + (long)ostream->_vptr_basic_ostream[-3]) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(ostream,",",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (ostream,(order->m_clientId)._M_dataplus._M_p,
                      (order->m_clientId)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," OWNER: ",8);
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(order->m_owner)._M_dataplus._M_p,(order->m_owner)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," PRICE: ",8);
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(order->m_price);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," QUANTITY: ",0xb);
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  return poVar1;
}

Assistant:

inline std::ostream& operator<<( std::ostream& ostream, const Order& order )
{
  return ostream
         << "ID: " << std::setw( 10 ) << "," << order.getClientID()
         << " OWNER: " << std::setw( 10 ) << "," << order.getOwner()
         << " PRICE: " << std::setw( 10 ) << "," << order.getPrice()
         << " QUANTITY: " << std::setw( 10 ) << "," << order.getQuantity();
}